

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp.cpp
# Opt level: O3

bool mg::data::mzp_read(string *data,Mzp *out)

{
  MzpArchiveHeader MVar1;
  pointer pMVar2;
  bool bVar3;
  MzpArchiveEntry *entry_1;
  pointer pMVar4;
  ulong uVar5;
  uint local_3c;
  MzpArchiveEntry local_38;
  MzpArchiveEntry entry;
  
  if (7 < data->_M_string_length) {
    MVar1 = *(MzpArchiveHeader *)(data->_M_dataplus)._M_p;
    out->header = MVar1;
    if (*(short *)((out->header).magic + 4) == 0x3030 && MVar1.magic._0_4_ == 0x6467726d) {
      pMVar4 = (out->entry_headers).
               super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((out->entry_headers).
          super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish != pMVar4) {
        (out->entry_headers).
        super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = pMVar4;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&out->entry_data,
                        (out->entry_data).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      if ((out->header).archive_entry_count != 0) {
        uVar5 = 0;
        do {
          local_38 = *(MzpArchiveEntry *)((data->_M_dataplus)._M_p + uVar5 * 8 + 8);
          std::vector<mg::data::Mzp::MzpArchiveEntry,std::allocator<mg::data::Mzp::MzpArchiveEntry>>
          ::emplace_back<mg::data::Mzp::MzpArchiveEntry&>
                    ((vector<mg::data::Mzp::MzpArchiveEntry,std::allocator<mg::data::Mzp::MzpArchiveEntry>>
                      *)&out->entry_headers,&local_38);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (out->header).archive_entry_count);
      }
      pMVar4 = (out->entry_headers).
               super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar2 = (out->entry_headers).
               super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = true;
      if (pMVar4 != pMVar2) {
        do {
          local_38 = (MzpArchiveEntry)
                     ((ulong)((*(int *)&(out->entry_headers).
                                        super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                               *(int *)&(out->entry_headers).
                                        super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start & 0xfffffff8U) +
                              (uint)pMVar4->byte_offset + (uint)pMVar4->sector_offset * 0x800 + 8) +
                     (long)(data->_M_dataplus)._M_p);
          local_3c = (uint)pMVar4->size_bytes | (pMVar4->size_sectors & 0xffe0) << 0xb;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*,unsigned_int>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &out->entry_data,(char **)&local_38,&local_3c);
          pMVar4 = pMVar4 + 1;
        } while (pMVar4 != pMVar2);
        bVar3 = true;
      }
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool mzp_read(const std::string &data, Mzp &out) {
  // Is file large enough to have a header
  if (data.size() < sizeof(Mzp::MzpArchiveHeader)) {
    return false;
  }

  // Read off header
  out.header = *reinterpret_cast<const Mzp::MzpArchiveHeader *>(&data[0]);
  out.header.to_host_order();

  // Valid magic?
  if (memcmp(out.header.magic, Mzp::FILE_MAGIC,
             sizeof(Mzp::MzpArchiveHeader::magic)) != 0) {
    return false;
  }

  // Clear output vecs
  out.entry_headers.clear();
  out.entry_data.clear();

  // Iterate the archive entries
  for (uint16_t i = 0; i < out.header.archive_entry_count; i++) {
    // Calculate start offset of header record
    std::string::size_type archive_header_offset =
        sizeof(Mzp::MzpArchiveHeader) + sizeof(Mzp::MzpArchiveEntry) * i;

    // Clone data
    Mzp::MzpArchiveEntry entry =
        *reinterpret_cast<const Mzp::MzpArchiveEntry *>(
            &data[archive_header_offset]);
    entry.to_host_order();

    // Add to header
    out.entry_headers.emplace_back(entry);
  }

  // Scan through and extract the actual archive data
  for (auto &entry : out.entry_headers) {
    out.entry_data.emplace_back(&data[out.archive_entry_start_offset(entry)],
                                entry.entry_data_size());
  }

  return true;
}